

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall GLDrawList::Reset(GLDrawList *this)

{
  if (this->sorted != (SortNode *)0x0) {
    SortNodes.usecount = this->SortNodeStart;
  }
  this->sorted = (SortNode *)0x0;
  if ((this->walls).Count != 0) {
    (this->walls).Count = 0;
  }
  if ((this->flats).Count != 0) {
    (this->flats).Count = 0;
  }
  if ((this->sprites).Count != 0) {
    (this->sprites).Count = 0;
  }
  if ((this->drawitems).Count != 0) {
    (this->drawitems).Count = 0;
  }
  return;
}

Assistant:

void GLDrawList::Reset()
{
	if (sorted) SortNodes.Release(SortNodeStart);
	sorted=NULL;
	walls.Clear();
	flats.Clear();
	sprites.Clear();
	drawitems.Clear();
}